

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Bool prvTidyelementIsAutonomousCustomFormat(ctmbstr element)

{
  char *pcVar1;
  char *ptr;
  ctmbstr element_local;
  
  if (((element == (ctmbstr)0x0) || (pcVar1 = strchr(element,0x2d), pcVar1 == (char *)0x0)) ||
     ((long)pcVar1 - (long)element < 1)) {
    element_local._4_4_ = no;
  }
  else {
    element_local._4_4_ = yes;
  }
  return element_local._4_4_;
}

Assistant:

Bool TY_(elementIsAutonomousCustomFormat)( ctmbstr element )
{
    if ( element )
    {
        const char *ptr = strchr(element, '-');

        /* Tag must contain hyphen not in first character. */
        if ( ptr && (ptr - element > 0) )
        {
            return yes;
        }
    }

    return no;
}